

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O2

int xmlTextWriterStartComment(xmlTextWriterPtr writer)

{
  int iVar1;
  int iVar2;
  int iVar3;
  xmlLinkPtr lk;
  void *pvVar4;
  undefined8 *data;
  
  if (writer == (xmlTextWriterPtr)0x0) {
    xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_INTERNAL_ERROR,
                    "xmlTextWriterStartComment : invalid writer!\n");
    return -1;
  }
  lk = xmlListFront(writer->nodes);
  iVar1 = 0;
  iVar3 = -1;
  iVar2 = 0;
  if ((((lk != (xmlLinkPtr)0x0) &&
       (pvVar4 = xmlLinkGetData(lk), iVar2 = iVar1, pvVar4 != (void *)0x0)) &&
      (iVar1 = *(int *)((long)pvVar4 + 8), iVar1 != 0)) && (iVar1 != 3)) {
    if (iVar1 != 1) {
      return -1;
    }
    iVar1 = xmlTextWriterOutputNSDecl(writer);
    if (iVar1 < 0) {
      return -1;
    }
    iVar2 = xmlOutputBufferWriteString(writer->out,">");
    if (iVar2 < 0) {
      return -1;
    }
    iVar2 = iVar2 + iVar1;
    if (writer->indent != 0) {
      iVar1 = xmlOutputBufferWriteString(writer->out,"\n");
      if (iVar1 < 0) {
        return -1;
      }
      iVar2 = iVar2 + iVar1;
    }
    *(undefined4 *)((long)pvVar4 + 8) = 3;
  }
  data = (undefined8 *)(*xmlMalloc)(0x10);
  if (data == (undefined8 *)0x0) {
    xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartElement : out of memory!\n");
  }
  else {
    *data = 0;
    *(undefined4 *)(data + 1) = 0x10;
    xmlListPushFront(writer->nodes,data);
    if (writer->indent != 0) {
      iVar1 = xmlTextWriterWriteIndent(writer);
      if (iVar1 < 0) {
        return -1;
      }
      iVar2 = iVar2 + iVar1;
    }
    iVar1 = xmlOutputBufferWriteString(writer->out,"<!--");
    if (-1 < iVar1) {
      iVar3 = iVar1 + iVar2;
    }
  }
  return iVar3;
}

Assistant:

int
xmlTextWriterStartComment(xmlTextWriterPtr writer)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterStartComment : invalid writer!\n");
        return -1;
    }

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk != 0) {
        p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
        if (p != 0) {
            switch (p->state) {
                case XML_TEXTWRITER_TEXT:
                case XML_TEXTWRITER_NONE:
                    break;
                case XML_TEXTWRITER_NAME:
                    /* Output namespace declarations */
                    count = xmlTextWriterOutputNSDecl(writer);
                    if (count < 0)
                        return -1;
                    sum += count;
                    count = xmlOutputBufferWriteString(writer->out, ">");
                    if (count < 0)
                        return -1;
                    sum += count;
                    if (writer->indent) {
                        count =
                            xmlOutputBufferWriteString(writer->out, "\n");
                        if (count < 0)
                            return -1;
                        sum += count;
                    }
                    p->state = XML_TEXTWRITER_TEXT;
                    break;
                default:
                    return -1;
            }
        }
    }

    p = (xmlTextWriterStackEntry *)
        xmlMalloc(sizeof(xmlTextWriterStackEntry));
    if (p == 0) {
        xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                        "xmlTextWriterStartElement : out of memory!\n");
        return -1;
    }

    p->name = NULL;
    p->state = XML_TEXTWRITER_COMMENT;

    xmlListPushFront(writer->nodes, p);

    if (writer->indent) {
        count = xmlTextWriterWriteIndent(writer);
        if (count < 0)
            return -1;
        sum += count;
    }

    count = xmlOutputBufferWriteString(writer->out, "<!--");
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}